

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O1

void If_CutSortInputPins(If_Man_t *p,If_Cut_t *pCut,int *pPinPerm,float *pPinDelays)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    pVVar4 = p->vObjs;
    uVar9 = 0;
    do {
      fVar2 = (&pCut[1].Area)[uVar9];
      if (((long)(int)fVar2 < 0) || (pVVar4->nSize <= (int)fVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pVVar4->pArray[(int)fVar2];
      if (pvVar5 == (void *)0x0) break;
      pPinPerm[uVar9] = (int)uVar9;
      pPinDelays[uVar9] = *(float *)((long)pvVar5 + 0x5c);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (byte)pCut->field_0x1f);
  }
  if (0x1ffffff < *(uint *)&pCut->field_0x1c) {
    uVar10 = *(uint *)&pCut->field_0x1c >> 0x18;
    uVar7 = 1;
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      uVar8 = uVar9 & 0xffffffff;
      if (uVar1 < uVar10) {
        uVar8 = uVar9 & 0xffffffff;
        uVar11 = uVar7;
        do {
          uVar6 = uVar11 & 0xffffffff;
          if (pPinDelays[pPinPerm[uVar11]] < pPinDelays[pPinPerm[(int)uVar8]] ||
              pPinDelays[pPinPerm[uVar11]] == pPinDelays[pPinPerm[(int)uVar8]]) {
            uVar6 = uVar8;
          }
          uVar8 = uVar6;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (uVar9 != uVar8) {
        iVar3 = pPinPerm[uVar9];
        pPinPerm[uVar9] = pPinPerm[(int)uVar8];
        pPinPerm[(int)uVar8] = iVar3;
      }
      uVar10 = *(uint *)&pCut->field_0x1c >> 0x18;
      uVar7 = uVar7 + 1;
      uVar9 = uVar1;
    } while ((long)uVar1 < (long)(int)(uVar10 - 1));
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_CutSortInputPins( If_Man_t * p, If_Cut_t * pCut, int * pPinPerm, float * pPinDelays )
{
    If_Obj_t * pLeaf;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < (int)pCut->nLeaves-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < (int)pCut->nLeaves; j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
/*
    // verify
    assert( pPinPerm[0] < (int)pCut->nLeaves );
    for ( i = 1; i < (int)pCut->nLeaves; i++ )
    {
        assert( pPinPerm[i] < (int)pCut->nLeaves );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
*/
}